

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

mecab_node_t * __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::lookup<false>
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,char *begin,char *end,
          Allocator<mecab_node_t,_mecab_path_t> *allocator,Lattice *lattice)

{
  bool bVar1;
  CharInfo CVar2;
  reference ppDVar3;
  const_reference pvVar4;
  char *pcVar5;
  mecab_node_t *pmVar6;
  Allocator<mecab_node_t,_mecab_path_t> *in_RCX;
  Dictionary *in_RDX;
  long in_RSI;
  char *in_RDI;
  mecab_node_t *new_node_4;
  size_t k_3;
  size_t size_4;
  Token *token_4;
  mecab_node_t *new_node_3;
  size_t k_2;
  size_t size_3;
  Token *token_3;
  size_t i_1;
  mecab_node_t *new_node_2;
  size_t k_1;
  size_t size_2;
  Token *token_2;
  CharInfo fail;
  char *tmp;
  mecab_node_t *new_node_1;
  size_t k;
  size_t size_1;
  Token *token_1;
  char *group_begin3;
  char *begin3;
  mecab_node_t *new_node;
  size_t j;
  Token *token;
  size_t size;
  size_t i;
  size_t n;
  const_iterator it;
  size_t results_size;
  result_type *daresults;
  char *begin2;
  size_t clen;
  size_t mblen;
  mecab_node_t *result_node;
  CharInfo cinfo;
  Token *token_00;
  Dictionary *dic;
  Dictionary *in_stack_fffffffffffffea0;
  size_t *in_stack_fffffffffffffea8;
  ulong uVar7;
  CharInfo *in_stack_fffffffffffffeb0;
  unsigned_long uVar8;
  CharProperty *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  CharProperty *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  ulong uVar9;
  size_t *in_stack_fffffffffffffee0;
  ulong local_118;
  ulong local_108;
  CharInfo local_ec;
  Dictionary *local_e8;
  mecab_node_t *local_e0;
  ulong local_d8;
  ulong local_d0;
  Token *local_c8;
  Dictionary *local_c0;
  Dictionary *local_b8;
  mecab_node_t *local_b0;
  ulong local_a8;
  Token *local_a0;
  size_t local_98;
  ulong local_90;
  ulong local_88;
  Dictionary **local_80;
  __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
  local_78;
  size_t local_70;
  result_type *local_68;
  undefined4 local_5c;
  char *local_58;
  Token local_50;
  mecab_node_t *local_40;
  CharInfo local_34 [3];
  Allocator<mecab_node_t,_mecab_path_t> *local_28;
  Dictionary *local_20;
  long local_18;
  mecab_node_t *local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  CharInfo::CharInfo(local_34);
  local_40 = (mecab_node_t *)0x0;
  local_50.feature = 0;
  local_50.compound = 0;
  local_50.lcAttr = 0;
  local_50.rcAttr = 0;
  local_50.posid = 0;
  local_50.wcost = 0;
  dic = local_20;
  if (0xfffe < (ulong)((long)local_20 - local_18)) {
    dic = (Dictionary *)(local_18 + 0xffff);
  }
  local_5c = *(undefined4 *)(in_RDI + 0x2f8);
  token_00 = &local_50;
  local_20 = dic;
  local_58 = CharProperty::seekToOtherType
                       (in_stack_fffffffffffffec8,
                        (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        (char *)in_stack_fffffffffffffeb8,
                        SUB84((ulong)in_stack_fffffffffffffed0 >> 0x20,0),in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffea8,in_stack_fffffffffffffee0);
  local_68 = Allocator<mecab_node_t,_mecab_path_t>::mutable_results
                       ((Allocator<mecab_node_t,_mecab_path_t> *)0x132100);
  local_70 = Allocator<mecab_node_t,_mecab_path_t>::results_size(local_28);
  local_78._M_current =
       (Dictionary **)
       std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::begin
                 ((vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *)token_00);
  while( true ) {
    local_80 = (Dictionary **)
               std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::end
                         ((vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *)
                          token_00);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
                        *)dic,(__normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
                               *)token_00);
    CVar2 = SUB84((ulong)in_stack_fffffffffffffed0 >> 0x20,0);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
    ::operator*(&local_78);
    local_88 = Dictionary::commonPrefixSearch
                         (in_stack_fffffffffffffea0,in_RDI,(size_t)dic,(result_type *)token_00,
                          0x1321a7);
    for (local_90 = 0; local_90 < local_88; local_90 = local_90 + 1) {
      ppDVar3 = __gnu_cxx::
                __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
                ::operator*(&local_78);
      local_98 = Dictionary::token_size(*ppDVar3,local_68 + local_90);
      ppDVar3 = __gnu_cxx::
                __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
                ::operator*(&local_78);
      local_a0 = Dictionary::token(*ppDVar3,local_68 + local_90);
      for (local_a8 = 0; local_a8 < local_98; local_a8 = local_a8 + 1) {
        local_b0 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                             ((Allocator<mecab_node_t,_mecab_path_t> *)dic);
        __gnu_cxx::
        __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
        ::operator*(&local_78);
        anon_unknown_20::read_node_info(dic,token_00,(Node **)0x1322a4);
        local_b0->length = (unsigned_short)local_68[local_90].length;
        local_b0->rlength = ((short)local_58 - (short)local_18) + local_b0->length;
        local_b0->surface = local_58;
        local_b0->stat = '\0';
        local_b0->char_type = (uchar)((uint)local_34[0] >> 0x12);
        local_b0->bnext = local_40;
        local_40 = local_b0;
      }
    }
    __gnu_cxx::
    __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
    ::operator++(&local_78);
  }
  if ((local_40 == (mecab_node_t *)0x0) || ((int)local_34[0] < 0)) {
    local_b8 = (Dictionary *)(local_58 + local_50._8_8_);
    local_c0 = (Dictionary *)0x0;
    if (local_20 < local_b8) {
      pvVar4 = std::
               vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                             *)(in_RDI + 0x2d8),(ulong)((uint)local_34[0] >> 0x12 & 0xff));
      local_c8 = pvVar4->first;
      pvVar4 = std::
               vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                             *)(in_RDI + 0x2d8),(ulong)((uint)local_34[0] >> 0x12 & 0xff));
      local_d0 = pvVar4->second;
      for (local_d8 = 0; CVar2 = SUB84((ulong)in_stack_fffffffffffffed0 >> 0x20,0),
          local_d8 < local_d0; local_d8 = local_d8 + 1) {
        local_e0 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                             ((Allocator<mecab_node_t,_mecab_path_t> *)dic);
        anon_unknown_20::read_node_info(dic,token_00,(Node **)0x1324d5);
        local_e0->char_type = (uchar)((uint)local_34[0] >> 0x12);
        local_e0->surface = local_58;
        local_e0->length = (short)local_b8 - (short)local_58;
        local_e0->rlength = (short)local_b8 - (short)local_18;
        local_e0->stat = '\x01';
        local_e0->bnext = local_40;
        pcVar5 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
        if (pcVar5 != (char *)0x0) {
          pcVar5 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
          local_e0->feature = pcVar5;
        }
        local_40 = local_e0;
      }
      if (local_40 != (mecab_node_t *)0x0) {
        return local_40;
      }
    }
    if (((uint)local_34[0] >> 0x1e & 1) != 0) {
      local_e8 = local_b8;
      CharInfo::CharInfo(&local_ec);
      token_00 = &local_50;
      local_b8 = (Dictionary *)
                 CharProperty::seekToOtherType
                           (in_stack_fffffffffffffec8,
                            (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            (char *)in_stack_fffffffffffffeb8,CVar2,in_stack_fffffffffffffeb0,
                            in_stack_fffffffffffffea8,in_stack_fffffffffffffee0);
      if ((ulong)local_50._0_8_ <= *(ulong *)(in_RDI + 0x4d8)) {
        std::
        vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
        ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                      *)(in_RDI + 0x2d8),(ulong)((uint)local_34[0] >> 0x12 & 0xff));
        pvVar4 = std::
                 vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                               *)(in_RDI + 0x2d8),(ulong)((uint)local_34[0] >> 0x12 & 0xff));
        uVar7 = pvVar4->second;
        for (local_108 = 0; local_108 < uVar7; local_108 = local_108 + 1) {
          pmVar6 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                             ((Allocator<mecab_node_t,_mecab_path_t> *)dic);
          anon_unknown_20::read_node_info(dic,token_00,(Node **)0x132744);
          pmVar6->char_type = (uchar)((uint)local_34[0] >> 0x12);
          pmVar6->surface = local_58;
          pmVar6->length = (short)local_b8 - (short)local_58;
          pmVar6->rlength = (short)local_b8 - (short)local_18;
          pmVar6->stat = '\x01';
          pmVar6->bnext = local_40;
          pcVar5 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
          if (pcVar5 != (char *)0x0) {
            pcVar5 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
            pmVar6->feature = pcVar5;
          }
          local_40 = pmVar6;
        }
      }
      local_c0 = local_b8;
      local_b8 = local_e8;
    }
    local_118 = 1;
    while ((local_118 <= ((uint)local_34[0] >> 0x1a & 0xf) && (local_b8 <= local_20))) {
      if (local_b8 != local_c0) {
        local_50.lcAttr = (undefined2)local_118;
        local_50.rcAttr = local_118._2_2_;
        local_50.posid = local_118._4_2_;
        local_50.wcost = local_118._6_2_;
        std::
        vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
        ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                      *)(in_RDI + 0x2d8),(ulong)((uint)local_34[0] >> 0x12 & 0xff));
        pvVar4 = std::
                 vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                               *)(in_RDI + 0x2d8),(ulong)((uint)local_34[0] >> 0x12 & 0xff));
        uVar7 = pvVar4->second;
        for (uVar9 = 0; uVar9 < uVar7; uVar9 = uVar9 + 1) {
          pmVar6 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                             ((Allocator<mecab_node_t,_mecab_path_t> *)dic);
          anon_unknown_20::read_node_info(dic,token_00,(Node **)0x132947);
          pmVar6->char_type = (uchar)((uint)local_34[0] >> 0x12);
          pmVar6->surface = local_58;
          pmVar6->length = (short)local_b8 - (short)local_58;
          pmVar6->rlength = (short)local_b8 - (short)local_18;
          pmVar6->stat = '\x01';
          pmVar6->bnext = local_40;
          pcVar5 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
          if (pcVar5 != (char *)0x0) {
            pcVar5 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
            pmVar6->feature = pcVar5;
          }
          local_40 = pmVar6;
        }
        CVar2 = CharProperty::getCharInfo
                          (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                           (char *)in_stack_fffffffffffffea8,(size_t *)in_stack_fffffffffffffea0);
        bVar1 = CharInfo::isKindOf(local_34,CVar2);
        if (((bVar1 ^ 0xffU) & 1) != 0) break;
        local_b8 = (Dictionary *)((long)&local_b8->_vptr_Dictionary + local_50._8_8_);
      }
      local_118 = local_118 + 1;
    }
    if (local_40 == (mecab_node_t *)0x0) {
      std::
      vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
      ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                    *)(in_RDI + 0x2d8),(ulong)((uint)local_34[0] >> 0x12 & 0xff));
      pvVar4 = std::
               vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                             *)(in_RDI + 0x2d8),(ulong)((uint)local_34[0] >> 0x12 & 0xff));
      uVar8 = pvVar4->second;
      for (uVar7 = 0; uVar7 < uVar8; uVar7 = uVar7 + 1) {
        pmVar6 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                           ((Allocator<mecab_node_t,_mecab_path_t> *)dic);
        anon_unknown_20::read_node_info(dic,token_00,(Node **)0x132b4b);
        pmVar6->char_type = (uchar)((uint)local_34[0] >> 0x12);
        pmVar6->surface = local_58;
        pmVar6->length = (short)local_b8 - (short)local_58;
        pmVar6->rlength = (short)local_b8 - (short)local_18;
        pmVar6->stat = '\x01';
        pmVar6->bnext = local_40;
        pcVar5 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
        if (pcVar5 != (char *)0x0) {
          pcVar5 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
          pmVar6->feature = pcVar5;
        }
        local_40 = pmVar6;
      }
    }
    local_8 = local_40;
  }
  else {
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

N *Tokenizer<N, P>::lookup(const char *begin, const char *end,
                           Allocator<N, P> *allocator, Lattice *lattice) const {
  CharInfo cinfo;
  N *result_node = 0;
  size_t mblen = 0;
  size_t clen = 0;

  end = static_cast<size_t>(end - begin) >= 65535 ? begin + 65535 : end;

  if (isPartial) {
    const size_t begin_pos = begin - lattice->sentence();
    for (size_t n = begin_pos + 1; n < lattice->size(); ++n) {
      if (lattice->boundary_constraint(n) == MECAB_TOKEN_BOUNDARY) {
        end = lattice->sentence() + n;
        break;
      }
    }
  }

  const char *begin2 = property_.seekToOtherType(begin, end, space_,
                                                 &cinfo, &mblen, &clen);

  Dictionary::result_type *daresults = allocator->mutable_results();
  const size_t results_size = allocator->results_size();

  for (std::vector<Dictionary *>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    const size_t n = (*it)->commonPrefixSearch(
        begin2,
        static_cast<size_t>(end - begin2),
        daresults, results_size);

    for (size_t i = 0; i < n; ++i) {
      size_t size = (*it)->token_size(daresults[i]);
      const Token *token = (*it)->token(daresults[i]);
      for (size_t j = 0; j < size; ++j) {
        N *new_node = allocator->newNode();
        read_node_info(**it, *(token + j), &new_node);
        new_node->length = daresults[i].length;
        new_node->rlength = begin2 - begin + new_node->length;
        new_node->surface = begin2;
        new_node->stat = MECAB_NOR_NODE;
        new_node->char_type = cinfo.default_type;
        if (isPartial && !is_valid_node(lattice, new_node)) {
          continue;
        }
        new_node->bnext = result_node;
        result_node = new_node;
      }
    }
  }

  if (result_node && !cinfo.invoke) {
    return result_node;
  }

  const char *begin3 = begin2 + mblen;
  const char *group_begin3 = 0;

  if (begin3 > end) {
    ADDUNKNWON;
    if (result_node) {
    return result_node;
  }
  }

  if (cinfo.group) {
    const char *tmp = begin3;
    CharInfo fail;
    begin3 = property_.seekToOtherType(begin3, end, cinfo,
                                       &fail, &mblen, &clen);
    if (clen <= max_grouping_size_) {
      ADDUNKNWON;
    }
    group_begin3 = begin3;
    begin3 = tmp;
  }

  for (size_t i = 1; i <= cinfo.length; ++i) {
    if (begin3 > end) {
      break;
    }
    if (begin3 == group_begin3) {
      continue;
    }
    clen = i;
    ADDUNKNWON;
    if (!cinfo.isKindOf(property_.getCharInfo(begin3, end, &mblen))) {
      break;
    }
    begin3 += mblen;
  }

  if (!result_node) {
    ADDUNKNWON;
  }

  if (isPartial && !result_node) {
    begin3 = begin2;
    while (true) {
      cinfo = property_.getCharInfo(begin3, end, &mblen);
      begin3 += mblen;
      if (begin3 > end ||
          lattice->boundary_constraint(begin3 - lattice->sentence())
          != MECAB_INSIDE_TOKEN) {
        break;
      }
    }
    ADDUNKNWON;

    if (!result_node) {
      N *new_node = allocator->newNode();
      new_node->char_type = cinfo.default_type;
      new_node->surface = begin2;
      new_node->length = begin3 - begin2;
      new_node->rlength = begin3 - begin;
      new_node->stat = MECAB_UNK_NODE;
      new_node->bnext = result_node;
      new_node->feature =
          lattice->feature_constraint(begin - lattice->sentence());
      CHECK_DIE(new_node->feature);
      result_node = new_node;
    }
  }

  return result_node;
}